

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::SVInt>::emplaceRealloc<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,pointer pos,SVInt *args)

{
  SVInt *this_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  byte *pbVar9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar10;
  ulong uVar11;
  EVP_PKEY_CTX *ctx;
  long lVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar4 = this->cap;
  if (uVar11 < uVar4 * 2) {
    uVar11 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar11 = 0x7ffffffffffffff;
  }
  lVar12 = (long)pos - (long)this->data_;
  pSVar7 = (pointer)operator_new(uVar11 << 4);
  this_00 = (SVInt *)((long)pSVar7 + lVar12);
  SVInt::SVInt(this_00,&args->super_SVIntStorage);
  pSVar8 = this->data_;
  sVar5 = this->len;
  ctx = (EVP_PKEY_CTX *)(pSVar8 + sVar5);
  pSVar6 = pSVar7;
  if (ctx == (EVP_PKEY_CTX *)pos) {
    if (sVar5 != 0) {
      lVar12 = 0;
      do {
        uVar3 = *(uint *)((long)&(pSVar8->super_SVIntStorage).bitWidth + lVar12);
        bVar1 = (&(pSVar8->super_SVIntStorage).signFlag)[lVar12];
        bVar2 = (&(pSVar8->super_SVIntStorage).unknownFlag)[lVar12];
        *(undefined8 *)((long)&(pSVar7->super_SVIntStorage).field_0 + lVar12) = 0;
        *(uint *)((long)&(pSVar7->super_SVIntStorage).bitWidth + lVar12) = uVar3;
        (&(pSVar7->super_SVIntStorage).signFlag)[lVar12] = bVar1;
        (&(pSVar7->super_SVIntStorage).unknownFlag)[lVar12] = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          ctx = *(EVP_PKEY_CTX **)((long)&(pSVar8->super_SVIntStorage).field_0 + lVar12);
        }
        else {
          ctx = *(EVP_PKEY_CTX **)((long)&(pSVar8->super_SVIntStorage).field_0 + lVar12);
          *(undefined8 *)((long)&(pSVar8->super_SVIntStorage).field_0 + lVar12) = 0;
        }
        *(EVP_PKEY_CTX **)((long)&(pSVar7->super_SVIntStorage).field_0 + lVar12) = ctx;
        lVar12 = lVar12 + 0x10;
      } while (sVar5 * 0x10 != lVar12);
    }
  }
  else {
    for (; pSVar8 != pos; pSVar8 = pSVar8 + 1) {
      uVar3 = (pSVar8->super_SVIntStorage).bitWidth;
      bVar1 = (pSVar8->super_SVIntStorage).signFlag;
      bVar2 = (pSVar8->super_SVIntStorage).unknownFlag;
      (pSVar6->super_SVIntStorage).field_0.val = 0;
      (pSVar6->super_SVIntStorage).bitWidth = uVar3;
      (pSVar6->super_SVIntStorage).signFlag = bVar1;
      (pSVar6->super_SVIntStorage).unknownFlag = bVar2;
      if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
        ctx = (EVP_PKEY_CTX *)(pSVar8->super_SVIntStorage).field_0.val;
      }
      else {
        ctx = (EVP_PKEY_CTX *)(pSVar8->super_SVIntStorage).field_0.val;
        (pSVar8->super_SVIntStorage).field_0.val = 0;
      }
      (pSVar6->super_SVIntStorage).field_0.val = (uint64_t)ctx;
      pSVar6 = pSVar6 + 1;
    }
    pSVar8 = this->data_;
    if (pSVar8 + sVar5 != pos) {
      pbVar9 = (byte *)((long)pSVar7 + lVar12 + 0x1d);
      do {
        uVar3 = (pos->super_SVIntStorage).bitWidth;
        bVar1 = (pos->super_SVIntStorage).signFlag;
        ctx = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)ctx >> 8),bVar1);
        bVar2 = (pos->super_SVIntStorage).unknownFlag;
        pbVar9[-0xd] = 0;
        pbVar9[-0xc] = 0;
        pbVar9[-0xb] = 0;
        pbVar9[-10] = 0;
        pbVar9[-9] = 0;
        pbVar9[-8] = 0;
        pbVar9[-7] = 0;
        pbVar9[-6] = 0;
        *(uint *)(pbVar9 + -5) = uVar3;
        pbVar9[-1] = bVar1;
        *pbVar9 = bVar2;
        if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
          aVar10 = (pos->super_SVIntStorage).field_0;
        }
        else {
          aVar10 = (pos->super_SVIntStorage).field_0;
          (pos->super_SVIntStorage).field_0.val = 0;
        }
        *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(pbVar9 + -0xd) = aVar10;
        pos = pos + 1;
        pbVar9 = pbVar9 + 0x10;
      } while (pos != pSVar8 + sVar5);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = uVar11;
  this->data_ = pSVar7;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}